

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O2

void libyuv::ScaleAddCols1_C
               (int dst_width,int boxheight,int x,int dx,uint16_t *src_ptr,uint8_t *dst_ptr)

{
  uint32_t uVar1;
  uint16_t *src_ptr_00;
  long lVar2;
  int iboxwidth;
  
  iboxwidth = 1;
  if (1 < dx >> 0x10) {
    iboxwidth = dx >> 0x10;
  }
  lVar2 = 0;
  if (dst_width < 1) {
    dst_width = 0;
  }
  src_ptr_00 = src_ptr + (x >> 0x10);
  for (; dst_width != (int)lVar2; lVar2 = lVar2 + 1) {
    uVar1 = SumPixels(iboxwidth,src_ptr_00);
    dst_ptr[lVar2] = (uint8_t)(uVar1 * (int)(0x10000 / (long)(boxheight * iboxwidth)) >> 0x10);
    src_ptr_00 = (uint16_t *)((long)src_ptr_00 + (ulong)(uint)(iboxwidth * 2));
  }
  return;
}

Assistant:

static void ScaleAddCols1_C(int dst_width,
                            int boxheight,
                            int x,
                            int dx,
                            const uint16_t* src_ptr,
                            uint8_t* dst_ptr) {
  int boxwidth = MIN1(dx >> 16);
  int scaleval = 65536 / (boxwidth * boxheight);
  int i;
  x >>= 16;
  for (i = 0; i < dst_width; ++i) {
    *dst_ptr++ = SumPixels(boxwidth, src_ptr + x) * scaleval >> 16;
    x += boxwidth;
  }
}